

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

OptionsData * Options::readOptions(void)

{
  mapped_type_conflict *pmVar1;
  OptionsData *in_RDI;
  key_type local_18 [4];
  
  in_RDI->graphicMode = graphicMode;
  local_18[3] = 0;
  pmVar1 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_18 + 3);
  in_RDI->imageToLoad_4 = (bool)(*pmVar1 & 1);
  local_18[2] = 1;
  pmVar1 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_18 + 2);
  in_RDI->imageToLoad_5 = (bool)(*pmVar1 & 1);
  local_18[1] = 2;
  pmVar1 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_18 + 1);
  in_RDI->imageToLoad_6 = (bool)(*pmVar1 & 1);
  local_18[0] = SEVEN;
  pmVar1 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,local_18);
  in_RDI->imageToLoad_7 = (bool)(*pmVar1 & 1);
  in_RDI->squareColor = tileColor;
  in_RDI->tileSize = tileSize;
  in_RDI->numberColor = numberColor;
  return in_RDI;
}

Assistant:

OptionsData Options::readOptions()
{
    return {
        graphicMode,
        imagesToLoad.at( BoardSize::FOUR ),
        imagesToLoad.at( BoardSize::FIVE ),
        imagesToLoad.at( BoardSize::SIX ),
        imagesToLoad.at( BoardSize::SEVEN ),
        tileColor,
        tileSize,
        numberColor,
    };
}